

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::mousePressEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QPointer<QItemSelectionModel> *this_00;
  long lVar1;
  QAbstractItemViewPrivate *this_01;
  Data *pDVar2;
  undefined1 uVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  SelectionFlag SVar7;
  SelectionFlag SVar8;
  int iVar9;
  QPoint QVar10;
  QPoint QVar11;
  ulong uVar12;
  QPoint QVar13;
  QModelIndex *pQVar14;
  QObject *pQVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  QPointF QVar17;
  int local_78;
  undefined4 local_74;
  QPoint local_70;
  QModelIndex local_68;
  QPersistentModelIndex index;
  Representation local_40;
  Representation RStack_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemViewPrivate **)(this + 8);
  this_01->releaseFromDoubleClick = false;
  QBasicTimer::stop();
  QVar17 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_68.r = QVar17.xp._0_4_;
  local_68.c = QVar17.xp._4_4_;
  local_68.i._0_4_ = QVar17.yp._0_4_;
  local_68.i._4_4_ = QVar17.yp._4_4_;
  QVar10 = QPointF::toPoint((QPointF *)&local_68);
  index.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))(&local_68,this);
  QPersistentModelIndex::QPersistentModelIndex(&index,&local_68);
  if ((this_01->pressClosedEditorWatcher).m_id == Invalid) {
    uVar3 = false;
  }
  else {
    uVar3 = ::comparesEqual(&this_01->lastEditedIndex,&index);
  }
  this_01->pressClosedEditor = (bool)uVar3;
  this_00 = &this_01->selectionModel;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar4) {
    if (this_01->state == EditingState) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
      bVar4 = QAbstractItemViewPrivate::hasEditor(this_01,&local_68);
      if (bVar4) goto LAB_004e2c67;
    }
    pDVar2 = (this_00->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar14 = (QModelIndex *)0x0;
    }
    else {
      pQVar14 = (QModelIndex *)(this_01->selectionModel).wp.value;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
    bVar4 = (bool)QItemSelectionModel::isSelected(pQVar14);
    this_01->pressedAlreadySelected = bVar4;
    QPersistentModelIndex::operator=(&this_01->pressedIndex,&index);
    (this_01->pressedModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
    super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
    SVar7 = (**(code **)(*(long *)this + 0x2e8))(this,&local_68,event);
    if (SVar7 == NoUpdate) {
      bVar5 = true;
    }
    else {
      bVar5 = QPersistentModelIndex::isValid();
      bVar5 = bVar5 ^ 1;
    }
    this_01->noSelectionOnMousePress = (bool)bVar5;
    QVar11 = QAbstractItemViewPrivate::offset(this_01);
    local_40 = QVar10.xp.m_i;
    QVar13.xp.m_i = local_40.m_i + QVar11.xp.m_i.m_i;
    RStack_3c = QVar10.yp.m_i;
    QVar13.yp.m_i = QVar11.yp.m_i.m_i + RStack_3c.m_i;
    this_01->draggedPosition = QVar13;
    if (this_01->dragEnabled == true) {
      this_01->pressedPosition = QVar13;
    }
    if ((SVar7 & Current) == NoUpdate) {
      this_01->pressedPosition = QVar13;
      QPersistentModelIndex::operator=(&this_01->currentSelectionStartIndex,&index);
    }
    else {
      cVar6 = QPersistentModelIndex::isValid();
      if (cVar6 == '\0') {
        currentIndex(&local_68,this);
        QPersistentModelIndex::operator=(&this_01->currentSelectionStartIndex,&local_68);
      }
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
    cVar6 = (**(code **)(*(long *)this + 0x2e0))(this,&local_68,0,event);
    if (cVar6 == '\0') {
      cVar6 = QPersistentModelIndex::isValid();
      if (cVar6 != '\0') {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
        uVar12 = (**(code **)(*(long *)this_01->model + 0x138))(this_01->model,&local_68);
        if ((uVar12 & 0x20) != 0) {
          bVar4 = this_01->autoScroll;
          this_01->autoScroll = false;
          pDVar2 = (this_01->selectionModel).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar15 = (QObject *)0x0;
          }
          else {
            pQVar15 = (this_01->selectionModel).wp.value;
          }
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
          (**(code **)(*(long *)pQVar15 + 0x60))(pQVar15,&local_68,0);
          this_01->autoScroll = bVar4;
          if ((SVar7 & Toggle) != NoUpdate) {
            pDVar2 = (this_00->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar14 = (QModelIndex *)0x0;
            }
            else {
              pQVar14 = (QModelIndex *)(this_01->selectionModel).wp.value;
            }
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
            bVar5 = QItemSelectionModel::isSelected(pQVar14);
            SVar8 = (uint)bVar5 * 2 + Select;
            this_01->ctrlDragSelectionFlag = SVar8;
            SVar7 = SVar7 & ~Toggle | SVar8;
          }
          if ((SVar7 & Current) == NoUpdate) {
            pQVar14 = &local_68;
            local_68.r = local_40.m_i;
            local_68.c = RStack_3c.m_i;
            local_68.i._0_4_ = local_40.m_i;
            local_68.i._4_4_ = RStack_3c.m_i;
          }
          else {
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_68,&this_01->currentSelectionStartIndex);
            auVar16 = (**(code **)(*(long *)this + 0x1e0))(this,&local_68);
            pQVar14 = (QModelIndex *)&local_78;
            local_78 = (int)(((long)auVar16._8_4_ + (long)auVar16._0_4_) / 2);
            local_74 = (int)(((auVar16._8_8_ >> 0x20) + (auVar16._0_8_ >> 0x20)) / 2);
            local_70 = QVar10;
          }
          (**(code **)(*(long *)this + 0x2c8))(this,pQVar14,SVar7);
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&index);
          pressed(this,&local_68);
          if (this_01->autoScroll == true) {
            iVar9 = QApplication::doubleClickInterval();
            QBasicTimer::start(&this_01->delayedAutoScroll,iVar9 + 100,(QObject *)this);
          }
          goto LAB_004e2c67;
        }
      }
      pQVar15 = (this_01->selectionModel).wp.value;
      local_68.r = -1;
      local_68.c = -1;
      local_68.i._0_4_ = 0;
      local_68.i._4_4_ = 0;
      local_68.m.ptr = (QAbstractItemModel *)0x0;
      (**(code **)(*(long *)pQVar15 + 0x68))(pQVar15,&local_68,2);
    }
  }
LAB_004e2c67:
  QPersistentModelIndex::~QPersistentModelIndex(&index);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    d->releaseFromDoubleClick = false;
    d->delayedAutoScroll.stop(); //any interaction with the view cancel the auto scrolling
    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    // this is the mouse press event that closed the last editor (via focus event)
    d->pressClosedEditor = d->pressClosedEditorWatcher.isActive() && d->lastEditedIndex == index;

    if (!d->selectionModel || (d->state == EditingState && d->hasEditor(index)))
        return;

    d->pressedAlreadySelected = d->selectionModel->isSelected(index);
    d->pressedIndex = index;
    d->pressedModifiers = event->modifiers();
    QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
    d->noSelectionOnMousePress = command == QItemSelectionModel::NoUpdate || !index.isValid();
    QPoint offset = d->offset();
    d->draggedPosition = pos + offset;

#if QT_CONFIG(draganddrop)
    // update the pressed position when drag was enable
    if (d->dragEnabled)
        d->pressedPosition = d->draggedPosition;
#endif

    if (!(command & QItemSelectionModel::Current)) {
        d->pressedPosition = pos + offset;
        d->currentSelectionStartIndex = index;
    }
    else if (!d->currentSelectionStartIndex.isValid())
        d->currentSelectionStartIndex = currentIndex();

    if (edit(index, NoEditTriggers, event))
        return;

    if (index.isValid() && d->isIndexEnabled(index)) {
        // we disable scrollTo for mouse press so the item doesn't change position
        // when the user is interacting with it (ie. clicking on it)
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        d->autoScroll = autoScroll;
        if (command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            d->ctrlDragSelectionFlag = d->selectionModel->isSelected(index) ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command |= d->ctrlDragSelectionFlag;
        }

        if (!(command & QItemSelectionModel::Current)) {
            setSelection(QRect(pos, QSize(1, 1)), command);
        } else {
            QRect rect(visualRect(d->currentSelectionStartIndex).center(), pos);
            setSelection(rect, command);
        }

        // signal handlers may change the model
        emit pressed(index);
        if (d->autoScroll) {
            //we delay the autoscrolling to filter out double click event
            //100 is to be sure that there won't be a double-click misinterpreted as a 2 single clicks
            d->delayedAutoScroll.start(QApplication::doubleClickInterval()+100, this);
        }

    } else {
        // Forces a finalize() even if mouse is pressed, but not on a item
        d->selectionModel->select(QModelIndex(), QItemSelectionModel::Select);
    }
}